

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O3

Expression **
wasm::Properties::getImmediateFallthroughPtr
          (Expression **currp,PassOptions *passOptions,Module *module,FallthroughBehavior behavior)

{
  Id IVar1;
  LocalSet *this;
  uintptr_t uVar2;
  Expression *a;
  Expression *b;
  long lVar3;
  bool bVar4;
  LocalSet *pLVar5;
  EffectAnalyzer local_190;
  
  this = (LocalSet *)*currp;
  if ((this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id == 1) {
    return currp;
  }
  IVar1 = (this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id;
  if (IVar1 < TryId) {
    switch(IVar1) {
    case BlockId:
      if (this->value != (Expression *)0x0) {
        return currp;
      }
      uVar2 = this[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression.type.id;
      if (uVar2 == 0) {
        return currp;
      }
      return (Expression **)
             (*(long *)&this[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression +
              uVar2 * 8 + -8);
    case IfId:
      lVar3 = *(long *)&this[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression;
      if (lVar3 == 0) {
        return currp;
      }
      if ((this->value->type).id == 1) goto switchD_00702fd2_caseD_3;
      if (*(long *)(lVar3 + 8) != 1) {
        return currp;
      }
      break;
    case BreakId:
      a = (Expression *)
          this[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression.type.id;
      if (a == (Expression *)0x0) {
        return currp;
      }
      b = *(Expression **)
           &this[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression;
      if (behavior != AllowTeeBrIf || b == (Expression *)0x0) {
        return currp;
      }
      bVar4 = EffectAnalyzer::canReorder(passOptions,module,a,b);
      if (!bVar4) {
        return currp;
      }
    case LoopId:
switchD_00702fd2_caseD_3:
      return (Expression **)(this + 1);
    default:
switchD_00702fd2_caseD_5:
      pLVar5 = (LocalSet *)0x0;
      if (IVar1 == BrOnId) {
        pLVar5 = this;
      }
      if (pLVar5 == (LocalSet *)0x0) {
        return currp;
      }
      return (Expression **)
             &pLVar5[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression.type;
    case LocalSetId:
      bVar4 = LocalSet::isTee(this);
      if (behavior != AllowTeeBrIf || !bVar4) {
        return currp;
      }
    }
  }
  else {
    if (IVar1 == TryId) {
      EffectAnalyzer::EffectAnalyzer
                (&local_190,passOptions,module,
                 *(Expression **)
                  &this[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression);
      EffectAnalyzer::~EffectAnalyzer(&local_190);
      if (local_190.throws_ != false) {
        return currp;
      }
      if (local_190.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        return currp;
      }
      goto switchD_00702fd2_caseD_3;
    }
    if (IVar1 == RefCastId) {
      return (Expression **)&this->index;
    }
    if (IVar1 != RefAsId) goto switchD_00702fd2_caseD_5;
    if (this->index - 1 < 2) {
      return currp;
    }
  }
  return &this->value;
}

Assistant:

inline Expression** getImmediateFallthroughPtr(
  Expression** currp,
  const PassOptions& passOptions,
  Module& module,
  FallthroughBehavior behavior = FallthroughBehavior::AllowTeeBrIf) {
  auto* curr = *currp;
  // If the current node is unreachable, there is no value
  // falling through.
  if (curr->type == Type::unreachable) {
    return currp;
  }
  if (auto* set = curr->dynCast<LocalSet>()) {
    if (set->isTee() && behavior == FallthroughBehavior::AllowTeeBrIf) {
      return &set->value;
    }
  } else if (auto* block = curr->dynCast<Block>()) {
    // if no name, we can't be broken to, and then can look at the fallthrough
    if (!block->name.is() && block->list.size() > 0) {
      return &block->list.back();
    }
  } else if (auto* loop = curr->dynCast<Loop>()) {
    return &loop->body;
  } else if (auto* iff = curr->dynCast<If>()) {
    if (iff->ifFalse) {
      // Perhaps just one of the two actually returns.
      if (iff->ifTrue->type == Type::unreachable) {
        return &iff->ifFalse;
      } else if (iff->ifFalse->type == Type::unreachable) {
        return &iff->ifTrue;
      }
    }
  } else if (auto* br = curr->dynCast<Break>()) {
    // Note that we must check for the ability to reorder the condition and the
    // value, as the value is first, which would be a problem here:
    //
    //  (br_if ..
    //    (local.get $x)    ;; value
    //    (tee_local $x ..) ;; condition
    //  )
    //
    // We must not say that the fallthrough value is $x, since it is the
    // *earlier* value of $x before the tee that is passed out. But, if we can
    // reorder then that means that the value could have been last and so we do
    // know the fallthrough in that case.
    if (br->condition && br->value &&
        behavior == FallthroughBehavior::AllowTeeBrIf &&
        EffectAnalyzer::canReorder(
          passOptions, module, br->condition, br->value)) {
      return &br->value;
    }
  } else if (auto* tryy = curr->dynCast<Try>()) {
    if (!EffectAnalyzer(passOptions, module, tryy->body).throws()) {
      return &tryy->body;
    }
  } else if (auto* as = curr->dynCast<RefCast>()) {
    return &as->ref;
  } else if (auto* as = curr->dynCast<RefAs>()) {
    // Extern conversions are not casts and actually produce new values.
    // Treating them as fallthroughs would lead to misoptimizations of
    // subsequent casts.
    if (as->op != AnyConvertExtern && as->op != ExternConvertAny) {
      return &as->value;
    }
  } else if (auto* br = curr->dynCast<BrOn>()) {
    return &br->ref;
  }
  return currp;
}